

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::debugging_internal::ParseBareFunctionType(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  int iVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  
  iVar10 = state->recursion_depth;
  iVar2 = state->steps;
  iVar9 = iVar10 + 1;
  state->recursion_depth = iVar9;
  iVar4 = iVar2 + 1;
  state->steps = iVar4;
  if (iVar2 < 0x20000 && iVar10 < 0x100) {
    pPVar1 = &state->parse_state;
    iVar10 = (state->parse_state).prev_name_idx;
    iVar2 = (state->parse_state).mangled_idx;
    iVar7 = (state->parse_state).out_cur_idx;
    uVar3 = *(uint *)&(state->parse_state).field_0xc;
    *(uint *)&(state->parse_state).field_0xc = uVar3 & 0x7fffffff;
    while( true ) {
      state->recursion_depth = iVar9 + 1;
      state->steps = iVar4 + 1;
      if ((0xff < iVar9) || (0x1ffff < iVar4)) goto LAB_00171a9d;
      iVar9 = pPVar1->mangled_idx;
      iVar4 = pPVar1->out_cur_idx;
      iVar5 = (state->parse_state).prev_name_idx;
      uVar6 = *(undefined4 *)&(state->parse_state).field_0xc;
      bVar8 = ParseTwoCharToken(state,"Ua");
      if (!bVar8) break;
      bVar8 = ParseName(state);
      if (!bVar8) break;
      iVar4 = state->steps;
      iVar9 = state->recursion_depth + -1;
      state->recursion_depth = iVar9;
    }
    pPVar1->mangled_idx = iVar9;
    pPVar1->out_cur_idx = iVar4;
    (state->parse_state).prev_name_idx = iVar5;
    *(undefined4 *)&(state->parse_state).field_0xc = uVar6;
    iVar9 = state->recursion_depth + -1;
LAB_00171a9d:
    state->recursion_depth = iVar9;
    bVar8 = OneOrMore(ParseType,state);
    if (bVar8) {
      *(uint *)&(state->parse_state).field_0xc =
           *(uint *)&(state->parse_state).field_0xc & 0x7fffffff | uVar3 & 0x80000000;
      MaybeAppend(state,"()");
    }
    else {
      (state->parse_state).prev_name_idx = iVar10;
      pPVar1->mangled_idx = iVar2;
      pPVar1->out_cur_idx = iVar7;
      *(uint *)&(state->parse_state).field_0xc = uVar3;
    }
    iVar10 = state->recursion_depth + -1;
  }
  else {
    bVar8 = false;
  }
  state->recursion_depth = iVar10;
  return bVar8;
}

Assistant:

static bool ParseBareFunctionType(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  DisableAppend(state);
  if (ZeroOrMore(ParseOverloadAttribute, state) &&
      OneOrMore(ParseType, state)) {
    RestoreAppend(state, copy.append);
    MaybeAppend(state, "()");
    return true;
  }
  state->parse_state = copy;
  return false;
}